

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.cpp
# Opt level: O0

int mbedtls_pk_sign_restartable
              (mbedtls_pk_context *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,
              uchar *sig,size_t sig_size,size_t *sig_len,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
              void *p_rng,mbedtls_pk_restart_ctx *rs_ctx)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  size_t *in_stack_ffffffffffffffa8;
  mbedtls_md_type_t in_stack_ffffffffffffffb0;
  
  if ((((in_ESI == 0) && (in_RCX == 0)) || (in_RDX != 0)) &&
     ((*in_RDI != 0 &&
      (iVar1 = pk_hashlen_helper(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8), iVar1 == 0)))
     ) {
    if (*(long *)(*in_RDI + 0x28) != 0) {
      iVar1 = (**(code **)(*in_RDI + 0x28))
                        (in_RDI,in_ESI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,in_stack_00000010
                         ,sig_size);
      return iVar1;
    }
    return -0x3f00;
  }
  return -16000;
}

Assistant:

int mbedtls_pk_sign_restartable(mbedtls_pk_context *ctx,
                                mbedtls_md_type_t md_alg,
                                const unsigned char *hash, size_t hash_len,
                                unsigned char *sig, size_t sig_size, size_t *sig_len,
                                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng,
                                mbedtls_pk_restart_ctx *rs_ctx)
{
    if ((md_alg != MBEDTLS_MD_NONE || hash_len != 0) && hash == NULL) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

    if (ctx->pk_info == NULL || pk_hashlen_helper(md_alg, &hash_len) != 0) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

#if defined(MBEDTLS_ECDSA_C) && defined(MBEDTLS_ECP_RESTARTABLE)
    /* optimization: use non-restartable version if restart disabled */
    if (rs_ctx != NULL &&
        mbedtls_ecp_restart_is_enabled() &&
        ctx->pk_info->sign_rs_func != NULL) {
        int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

        if ((ret = pk_restart_setup(rs_ctx, ctx->pk_info)) != 0) {
            return ret;
        }

        ret = ctx->pk_info->sign_rs_func(ctx, md_alg,
                                         hash, hash_len,
                                         sig, sig_size, sig_len,
                                         f_rng, p_rng, rs_ctx->rs_ctx);

        if (ret != MBEDTLS_ERR_ECP_IN_PROGRESS) {
            mbedtls_pk_restart_free(rs_ctx);
        }

        return ret;
    }
#else /* MBEDTLS_ECDSA_C && MBEDTLS_ECP_RESTARTABLE */
    (void) rs_ctx;
#endif /* MBEDTLS_ECDSA_C && MBEDTLS_ECP_RESTARTABLE */

    if (ctx->pk_info->sign_func == NULL) {
        return MBEDTLS_ERR_PK_TYPE_MISMATCH;
    }

    return ctx->pk_info->sign_func(ctx, md_alg,
                                   hash, hash_len,
                                   sig, sig_size, sig_len,
                                   f_rng, p_rng);
}